

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O3

void __thiscall
http_request_line_parsing_simple01_Test::TestBody(http_request_line_parsing_simple01_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  http_request_line request_line;
  AssertHelper local_88;
  Message local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  string local_68;
  sub_string local_48;
  http_request_line local_38;
  
  sub_string::sub_string((sub_string *)&local_38,"OPTIONS * HTTP/1.1\r\n","");
  local_48.begin_ = (char *)local_38._0_8_;
  local_48.end_ = local_38.uri.begin_;
  parse_request_line(&local_38,&local_48);
  local_80.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<http_request_method,http_request_method>
            ((internal *)&local_68,"request_line.method","http_request_method::OPTIONS",
             &local_38.method,(http_request_method *)&local_80);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_80);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<http_version,http_version>
            ((internal *)&local_68,"request_line.version","http_version::HTTP_11",
             (http_version *)((long)&local_38 + 0x18),(http_version *)&local_80);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_80);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = sub_string::empty(&local_48);
  local_80.ss_.ptr_._0_4_ = CONCAT31(local_80.ss_.ptr_._1_3_,bVar1);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&local_80,(AssertionResult *)0x1450b9,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x7c,(char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                      (char)local_68._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
        &local_68.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p));
    }
    if (local_88.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(http_request_method_parsing, invalid02)
{
    sub_string str = sub_string::literal("");
    EXPECT_THROW(parse_request_method(str), http_parsing_error);
}